

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int NumberTest(lua_State *L)

{
  LuaArgType LVar1;
  double value;
  
  LVar1 = CLua::GetArgumentType(pLua,1);
  if (LVar1 != ARG_TYPE_NUMBER) {
    puts("Fail: NumberTest argument is not a Number");
    sLuaBasedTestResult = sLuaBasedTestResult + -5;
  }
  value = CLua::GetNumberArgument(pLua,1,INFINITY);
  CLua::PushNumber(pLua,value);
  return 1;
}

Assistant:

LuaGlue(NumberTest)
{
    if (pLua->GetArgumentType(1) != LuaArgType::ARG_TYPE_NUMBER)
    {
        printf("Fail: NumberTest argument is not a Number\n");
        sLuaBasedTestResult += -5;
    }
    double r = pLua->GetNumberArgument(1, INFINITY);
    pLua->PushNumber(r);
    return 1;
}